

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ack_message_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::AckMessageTest_TestEncode_Test::TestBody
          (AckMessageTest_TestEncode_Test *this)

{
  uint32_t in_ECX;
  char *message;
  AssertHelper local_70;
  AssertionResult gtest_ar;
  string local_58;
  ByteBuffer buffer;
  
  bidfx_public_api::price::pixie::AckMessage::Encode((int)(HexEncoderDecoder *)&buffer);
  tools::HexEncoderDecoder::StreamAsHex_abi_cxx11_
            (&local_58,(HexEncoderDecoder *)&buffer,(ByteBuffer *)0x18,in_ECX);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"kEncodedMessageV2","HexEncoderDecoder::StreamAsHex(buffer, 24)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             kEncodedMessageV2_abi_cxx11_,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/ack_message_test.cpp"
               ,0x28,message);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(&buffer);
  return;
}

Assistant:

TEST(AckMessageTest, TestEncode)
{
    ByteBuffer buffer = ackMessage.Encode(3);
    ASSERT_EQ(kEncodedMessageV2, HexEncoderDecoder::StreamAsHex(buffer, 24));
}